

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void cppcms::json::traits<char[7]>::set(value *v,vtype *in)

{
  char *in_RSI;
  string *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  cppcms::json::value::str(in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

static void set(value &v,vtype const &in)
		{					
			v.str(in);
		}